

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefCast
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,RefCast *curr)

{
  Expression **childp;
  HeapType local_38;
  Type local_30;
  HeapType local_28;
  BasicHeapType local_1c;
  RefCast *pRStack_18;
  BasicHeapType top;
  RefCast *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  pRStack_18 = curr;
  curr_local = (RefCast *)this;
  local_28 = wasm::Type::getHeapType
                       (&(curr->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression
                         .type);
  local_1c = HeapType::getTop(&local_28);
  childp = &pRStack_18->ref;
  HeapType::HeapType(&local_38,local_1c);
  wasm::Type::Type(&local_30,local_38,Nullable,Inexact);
  note(this,childp,local_30);
  return;
}

Assistant:

void visitRefCast(RefCast* curr) {
    auto top = curr->type.getHeapType().getTop();
    note(&curr->ref, Type(top, Nullable));
  }